

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlChar * xmlDictLookup(xmlDictPtr dict,xmlChar *name,int len)

{
  _xmlDict *p_Var1;
  xmlChar *pxVar2;
  int iVar3;
  size_t sVar4;
  unsigned_long uVar5;
  ulong uVar6;
  xmlDictStringsPtr_conflict pxVar7;
  _xmlDictEntry *p_Var8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  _xmlDictEntry *p_Var12;
  ulong uVar13;
  xmlChar *pxVar14;
  uint namelen;
  ulong uVar15;
  ulong uVar16;
  _xmlDictEntry *p_Var17;
  _xmlDictEntry *p_Var18;
  
  if (name == (xmlChar *)0x0 || dict == (xmlDictPtr)0x0) {
    return (xmlChar *)0x0;
  }
  sVar4 = (size_t)(uint)len;
  if (len < 0) {
    sVar4 = strlen((char *)name);
  }
  uVar13 = dict->limit;
  namelen = (uint)sVar4;
  if (uVar13 == 0) {
    if (0x3fffffff < namelen) {
      return (xmlChar *)0x0;
    }
  }
  else if (0x3fffffff < namelen || uVar13 <= (sVar4 & 0xffffffff)) {
    return (xmlChar *)0x0;
  }
  uVar15 = dict->size;
  if (uVar15 == 0x80) {
    uVar5 = xmlDictComputeFastKey(name,namelen,dict->seed);
  }
  else if (namelen == 0) {
    uVar5 = 0;
  }
  else {
    uVar10 = dict->seed;
    uVar11 = 0;
    do {
      uVar10 = (name[uVar11] + uVar10) * 0x401;
      uVar10 = uVar10 >> 6 ^ uVar10;
      uVar11 = uVar11 + 1;
    } while ((sVar4 & 0xffffffff) != uVar11);
    uVar5 = (unsigned_long)((uVar10 * 9 >> 0xb ^ uVar10 * 9) * 0x8001);
  }
  uVar16 = 0;
  uVar11 = uVar5 % uVar15;
  if (dict->dict[uVar11].valid == 0) {
    p_Var18 = (_xmlDictEntry *)0x0;
  }
  else {
    p_Var18 = dict->dict + uVar11;
    if (p_Var18->next == (_xmlDictEntry *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      p_Var8 = p_Var18->next;
      p_Var17 = p_Var18;
      do {
        p_Var18 = p_Var8;
        if ((p_Var17->okey == uVar5) && (p_Var17->len == namelen)) {
          pxVar14 = p_Var17->name;
          iVar3 = bcmp(pxVar14,name,sVar4 & 0xffffffff);
          if (iVar3 == 0) {
            return pxVar14;
          }
        }
        uVar16 = uVar16 + 1;
        p_Var8 = p_Var18->next;
        p_Var17 = p_Var18;
      } while (p_Var18->next != (_xmlDictEntry *)0x0);
    }
    if ((p_Var18->okey == uVar5) && (p_Var18->len == namelen)) {
      pxVar14 = p_Var18->name;
      iVar3 = bcmp(pxVar14,name,sVar4 & 0xffffffff);
      if (iVar3 == 0) {
        return pxVar14;
      }
    }
  }
  p_Var1 = dict->subdict;
  if (p_Var1 != (_xmlDict *)0x0) {
    uVar9 = p_Var1->size;
    uVar6 = uVar5;
    if (uVar15 == 0x80) {
      uVar15 = 0x80;
      if (uVar9 != 0x80) {
        if ((int)namelen < 1) {
          uVar6 = 0;
          uVar15 = uVar9;
        }
        else {
          uVar10 = p_Var1->seed;
          uVar15 = 0;
          do {
            uVar10 = (name[uVar15] + uVar10) * 0x401;
            uVar10 = uVar10 >> 6 ^ uVar10;
            uVar15 = uVar15 + 1;
          } while ((sVar4 & 0xffffffff) != uVar15);
          uVar6 = (ulong)((uVar10 * 9 >> 0xb ^ uVar10 * 9) * 0x8001);
          uVar15 = uVar9;
        }
      }
    }
    else {
      uVar15 = uVar9;
      if (uVar9 == 0x80) {
        uVar6 = xmlDictComputeFastKey(name,namelen,p_Var1->seed);
        uVar15 = 0x80;
      }
    }
    if (p_Var1->dict[uVar6 % uVar15].valid != 0) {
      p_Var8 = p_Var1->dict + uVar6 % uVar15;
      if (p_Var8->next != (_xmlDictEntry *)0x0) {
        p_Var17 = p_Var8->next;
        p_Var12 = p_Var8;
        do {
          p_Var8 = p_Var17;
          if ((p_Var12->okey == uVar6) && (p_Var12->len == namelen)) {
            pxVar14 = p_Var12->name;
            iVar3 = bcmp(pxVar14,name,sVar4 & 0xffffffff);
            if (iVar3 == 0) {
              return pxVar14;
            }
          }
          uVar16 = uVar16 + 1;
          p_Var17 = p_Var8->next;
          p_Var12 = p_Var8;
        } while (p_Var8->next != (_xmlDictEntry *)0x0);
      }
      if ((p_Var8->okey == uVar6) && (p_Var8->len == namelen)) {
        pxVar14 = p_Var8->name;
        iVar3 = bcmp(pxVar14,name,sVar4 & 0xffffffff);
        if (iVar3 == 0) {
          return pxVar14;
        }
      }
    }
  }
  pxVar7 = dict->strings;
  if (pxVar7 != (xmlDictStringsPtr_conflict)0x0) {
    uVar9 = 0;
    uVar15 = 0;
    do {
      pxVar14 = pxVar7->free;
      if ((sVar4 & 0xffffffff) < (ulong)((long)pxVar7->end - (long)pxVar14)) goto LAB_00141b0d;
      uVar6 = pxVar7->size;
      if (uVar15 < uVar6) {
        uVar15 = uVar6;
      }
      pxVar7 = pxVar7->next;
      uVar9 = uVar9 + uVar6;
    } while (pxVar7 != (xmlDictStringsPtr)0x0);
    if ((uVar13 != 0) && (uVar13 < uVar9)) {
      return (xmlChar *)0x0;
    }
    if (uVar15 != 0) {
      uVar15 = uVar15 << 2;
      goto LAB_00141aaf;
    }
  }
  uVar15 = 1000;
LAB_00141aaf:
  uVar13 = (ulong)(namelen * 4);
  if (namelen * 4 < uVar15) {
    uVar13 = uVar15;
  }
  pxVar7 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar13 + 0x30);
  if (pxVar7 != (xmlDictStringsPtr_conflict)0x0) {
    pxVar7->size = uVar13;
    pxVar7->nbStrings = 0;
    pxVar14 = pxVar7->array;
    pxVar7->free = pxVar14;
    pxVar7->end = pxVar7->array + uVar13;
    pxVar7->next = dict->strings;
    dict->strings = pxVar7;
LAB_00141b0d:
    memcpy(pxVar14,name,sVar4 & 0xffffffff);
    pxVar2 = pxVar7->free;
    pxVar7->free = pxVar2 + (sVar4 & 0xffffffff) + 1;
    pxVar2[sVar4 & 0xffffffff] = '\0';
    pxVar7->nbStrings = pxVar7->nbStrings + 1;
    if (pxVar14 != (xmlChar *)0x0) {
      if (p_Var18 == (_xmlDictEntry *)0x0) {
        p_Var18 = dict->dict;
        p_Var18[uVar11].name = pxVar14;
        p_Var18[uVar11].len = namelen;
        p_Var18[uVar11].next = (_xmlDictEntry *)0x0;
        p_Var18[uVar11].valid = 1;
        p_Var18[uVar11].okey = uVar5;
      }
      else {
        p_Var8 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
        if (p_Var8 == (_xmlDictEntry *)0x0) {
          return (xmlChar *)0x0;
        }
        p_Var8->name = pxVar14;
        p_Var8->len = namelen;
        p_Var8->next = (_xmlDictEntry *)0x0;
        p_Var8->valid = 1;
        p_Var8->okey = uVar5;
        p_Var18->next = p_Var8;
      }
      dict->nbElems = dict->nbElems + 1;
      if (uVar16 < 4) {
        return pxVar14;
      }
      if (0xaaa < dict->size) {
        return pxVar14;
      }
      iVar3 = xmlDictGrow(dict,dict->size * 6);
      if (iVar3 == 0) {
        return pxVar14;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictLookup(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey, nbi = 0;
    xmlDictEntryPtr entry;
    xmlDictEntryPtr insert;
    const xmlChar *ret;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;

    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	    nbi++;
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
		nbi++;
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
	key = okey % dict->size;
    }

    ret = xmlDictAddString(dict, name, l);
    if (ret == NULL)
        return(NULL);
    if (insert == NULL) {
	entry = &(dict->dict[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlDictEntry));
	if (entry == NULL)
	     return(NULL);
    }
    entry->name = ret;
    entry->len = l;
    entry->next = NULL;
    entry->valid = 1;
    entry->okey = okey;


    if (insert != NULL)
	insert->next = entry;

    dict->nbElems++;

    if ((nbi > MAX_HASH_LEN) &&
        (dict->size <= ((MAX_DICT_HASH / 2) / MAX_HASH_LEN))) {
	if (xmlDictGrow(dict, MAX_HASH_LEN * 2 * dict->size) != 0)
	    return(NULL);
    }
    /* Note that entry may have been freed at this point by xmlDictGrow */

    return(ret);
}